

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl.h
# Opt level: O0

AGLProgram aGLProgramCreate(char **vertex,char **fragment)

{
  int local_30;
  GLuint local_2c;
  GLint status;
  GLuint fragment_shader;
  GLuint vertex_shader;
  GLuint program;
  char **fragment_local;
  char **vertex_local;
  
  _vertex_shader = fragment;
  fragment_local = vertex;
  local_2c = a__GLCreateShader(0x8b30,fragment);
  if (local_2c == 0) {
    vertex_local._4_4_ = 0xffffffff;
  }
  else {
    status = a__GLCreateShader(0x8b31,fragment_local);
    if (status == 0) {
      glDeleteShader(local_2c);
      vertex_local._4_4_ = 0xfffffffe;
    }
    else {
      fragment_shader = glCreateProgram();
      glAttachShader(fragment_shader,local_2c);
      glAttachShader(fragment_shader,status);
      glLinkProgram(fragment_shader);
      glDeleteShader(local_2c);
      glDeleteShader(status);
      glGetProgramiv(fragment_shader,0x8b82,&local_30);
      if (local_30 == 1) {
        vertex_local._4_4_ = fragment_shader;
      }
      else {
        glGetProgramInfoLog(fragment_shader,0x400,0,a_gl_error);
        glDeleteProgram(fragment_shader);
        vertex_local._4_4_ = 0xfffffffd;
      }
    }
  }
  return vertex_local._4_4_;
}

Assistant:

GLint aGLProgramCreate(const char *const *vertex, const char *const *fragment) {
	GLuint program;
	GLuint vertex_shader, fragment_shader;
	fragment_shader = a__GLCreateShader(GL_FRAGMENT_SHADER, fragment);
	if (fragment_shader == 0)
		return -1;

	vertex_shader = a__GLCreateShader(GL_VERTEX_SHADER, vertex);
	if (vertex_shader == 0) {
		AGL__CALL(glDeleteShader(fragment_shader));
		return -2;
	}

	program = glCreateProgram();
	AGL__CALL(glAttachShader(program, fragment_shader));
	AGL__CALL(glAttachShader(program, vertex_shader));
	AGL__CALL(glLinkProgram(program));

	AGL__CALL(glDeleteShader(fragment_shader));
	AGL__CALL(glDeleteShader(vertex_shader));

	{
		GLint status;
		AGL__CALL(glGetProgramiv(program, GL_LINK_STATUS, &status));
		if (status != GL_TRUE) {
			AGL__CALL(glGetProgramInfoLog(program, sizeof(a_gl_error), 0, a_gl_error));
			AGL__CALL(glDeleteProgram(program));
			return -3;
		}
	}

	return program;
}